

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O3

void __thiscall
QTextCursor::insertBlock(QTextCursor *this,QTextBlockFormat *format,QTextCharFormat *_charFormat)

{
  int iVar1;
  QTextDocumentPrivate *pQVar2;
  QTextCursorPrivate *pQVar3;
  char *__filename;
  long in_FS_OFFSET;
  undefined1 local_38 [16];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = (this->d).d.ptr;
  if (pQVar3 != (QTextCursorPrivate *)0x0) {
    if ((__atomic_base<int>)
        *(__int_type *)
         &(pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value != (__atomic_base<int>)0x1) {
      QSharedDataPointer<QTextCursorPrivate>::detach_helper(&this->d);
      pQVar3 = (this->d).d.ptr;
    }
    if (pQVar3->priv != (QTextDocumentPrivate *)0x0) {
      local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QTextFormat::QTextFormat((QTextFormat *)local_38,&_charFormat->super_QTextFormat);
      __filename = (char *)0x0;
      QTextFormat::clearProperty((QTextFormat *)local_38,0);
      pQVar3 = (this->d).d.ptr;
      if ((__atomic_base<int>)
          *(__int_type *)
           &(pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value != (__atomic_base<int>)0x1) {
        QSharedDataPointer<QTextCursorPrivate>::detach_helper(&this->d);
        pQVar3 = (this->d).d.ptr;
      }
      pQVar2 = pQVar3->priv;
      iVar1 = pQVar2->editBlock;
      pQVar2->editBlock = iVar1 + 1;
      if (iVar1 == 0) {
        pQVar2->revision = pQVar2->revision + 1;
      }
      if ((__int_type)
          (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> != 1) {
        QSharedDataPointer<QTextCursorPrivate>::detach_helper(&this->d);
        pQVar3 = (this->d).d.ptr;
      }
      QTextCursorPrivate::remove(pQVar3,__filename);
      pQVar3 = (this->d).d.ptr;
      if ((__atomic_base<int>)
          *(__int_type *)
           &(pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value != (__atomic_base<int>)0x1) {
        QSharedDataPointer<QTextCursorPrivate>::detach_helper(&this->d);
        pQVar3 = (this->d).d.ptr;
      }
      QTextCursorPrivate::insertBlock(pQVar3,format,(QTextCharFormat *)local_38);
      pQVar3 = (this->d).d.ptr;
      if ((__atomic_base<int>)
          *(__int_type *)
           &(pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value != (__atomic_base<int>)0x1) {
        QSharedDataPointer<QTextCursorPrivate>::detach_helper(&this->d);
        pQVar3 = (this->d).d.ptr;
      }
      QTextDocumentPrivate::endEditBlock(pQVar3->priv);
      pQVar3 = (this->d).d.ptr;
      if ((__atomic_base<int>)
          *(__int_type *)
           &(pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value != (__atomic_base<int>)0x1) {
        QSharedDataPointer<QTextCursorPrivate>::detach_helper(&this->d);
        pQVar3 = (this->d).d.ptr;
      }
      QTextCursorPrivate::setX(pQVar3);
      QTextFormat::~QTextFormat((QTextFormat *)local_38);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextCursor::insertBlock(const QTextBlockFormat &format, const QTextCharFormat &_charFormat)
{
    if (!d || !d->priv)
        return;

    QTextCharFormat charFormat = _charFormat;
    charFormat.clearProperty(QTextFormat::ObjectIndex);

    d->priv->beginEditBlock();
    d->remove();
    d->insertBlock(format, charFormat);
    d->priv->endEditBlock();
    d->setX();
}